

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O3

void aom_free_pyramid(ImagePyramid *pyr)

{
  if (pyr != (ImagePyramid *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)pyr);
    aom_free(pyr->buffer_alloc);
    aom_free(pyr->layers);
    aom_free(pyr);
    return;
  }
  return;
}

Assistant:

void aom_free_pyramid(ImagePyramid *pyr) {
  if (pyr) {
#if CONFIG_MULTITHREAD
    pthread_mutex_destroy(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
    aom_free(pyr->buffer_alloc);
    aom_free(pyr->layers);
    aom_free(pyr);
  }
}